

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicBuffer.h
# Opt level: O0

void __thiscall
aeron::concurrent::AtomicBuffer::wrap(AtomicBuffer *this,uint8_t *buffer,size_t length)

{
  size_t length_local;
  uint8_t *buffer_local;
  AtomicBuffer *this_local;
  
  this->m_buffer = buffer;
  this->m_length = (length_t)length;
  return;
}

Assistant:

inline void wrap(std::uint8_t* buffer, size_t length)
    {
#if !defined(DISABLE_BOUNDS_CHECKS)
        if (AERON_COND_EXPECT(length > std::numeric_limits<util::index_t>::max(), true))
        {
            throw aeron::util::OutOfBoundsException(
                aeron::util::strPrintf("length out of bounds[%p]: length=%lld", this, static_cast<long long>(length)),
                SOURCEINFO);
        }
#endif

        m_buffer = buffer;
        m_length = static_cast<util::index_t>(length);
    }